

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcSizeAfterConstraint(ImGuiWindow *window,ImVec2 new_size)

{
  ImGuiSizeCallback p_Var1;
  ImGuiContext *pIVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImGuiSizeCallbackData data;
  ImGuiSizeCallbackData local_38;
  
  pIVar2 = GImGui;
  if ((GImGui->NextWindowData).SizeConstraintCond != 0) {
    fVar9 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
    fVar7 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
    fVar6 = new_size.x;
    fVar8 = new_size.y;
    if ((fVar9 < 0.0) || (fVar10 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar10 < 0.0))
    {
      local_38.DesiredSize.x = (window->SizeFull).x;
    }
    else {
      if (fVar6 <= fVar10) {
        fVar10 = fVar6;
      }
      local_38.DesiredSize.x =
           (float)(-(uint)(fVar6 < fVar9) & (uint)fVar9 | ~-(uint)(fVar6 < fVar9) & (uint)fVar10);
    }
    if ((fVar7 < 0.0) || (fVar9 = (GImGui->NextWindowData).SizeConstraintRect.Max.y, fVar9 < 0.0)) {
      local_38.DesiredSize.y = (window->SizeFull).y;
    }
    else {
      if (fVar8 <= fVar9) {
        fVar9 = fVar8;
      }
      local_38.DesiredSize.y =
           (float)(-(uint)(fVar8 < fVar7) & (uint)fVar7 | ~-(uint)(fVar8 < fVar7) & (uint)fVar9);
    }
    p_Var1 = (GImGui->NextWindowData).SizeCallback;
    if (p_Var1 != (ImGuiSizeCallback)0x0) {
      local_38.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
      local_38.Pos = window->Pos;
      local_38.CurrentSize = window->SizeFull;
      (*p_Var1)(&local_38);
    }
    new_size.x = (float)(int)local_38.DesiredSize.x;
    new_size.y = (float)(int)local_38.DesiredSize.y;
  }
  uVar5 = window->Flags;
  if ((uVar5 & 0x1000040) == 0) {
    fVar9 = (pIVar2->Style).WindowMinSize.x;
    fVar7 = (pIVar2->Style).WindowMinSize.y;
    fVar6 = new_size.x;
    uVar3 = -(uint)(fVar9 <= fVar6);
    uVar4 = -(uint)(fVar7 <= new_size.y);
    fVar8 = (float)(~uVar4 & (uint)fVar7 | (uint)new_size.y & uVar4);
    fVar10 = 0.0;
    fVar7 = 0.0;
    if ((uVar5 & 1) == 0) {
      fVar7 = (GImGui->Style).FramePadding.y;
      fVar7 = fVar7 + fVar7 + GImGui->FontBaseSize * window->FontWindowScale;
    }
    if ((uVar5 >> 10 & 1) != 0) {
      fVar10 = (GImGui->Style).FramePadding.y;
      fVar10 = fVar10 + fVar10 +
               GImGui->FontBaseSize * window->FontWindowScale + (window->DC).MenuBarOffset.y;
    }
    fVar11 = (pIVar2->Style).WindowRounding + -1.0;
    fVar7 = (float)(~-(uint)(fVar11 <= 0.0) & (uint)fVar11) + fVar7 + fVar10;
    uVar5 = -(uint)(fVar7 <= fVar8);
    new_size.y = (float)(uVar5 & (uint)fVar8 | ~uVar5 & (uint)fVar7);
    new_size.x = (float)(~uVar3 & (uint)fVar9 | uVar3 & (uint)fVar6);
  }
  return new_size;
}

Assistant:

static ImVec2 CalcSizeAfterConstraint(ImGuiWindow* window, ImVec2 new_size)
{
    ImGuiContext& g = *GImGui;
    if (g.NextWindowData.SizeConstraintCond != 0)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = ImFloor(new_size.x);
        new_size.y = ImFloor(new_size.y);
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, window->TitleBarHeight() + window->MenuBarHeight() + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}